

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O0

void __thiscall json_service::compiles3cr(json_service *this,vector<int,_std::allocator<int>_> *f)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  runtime_error *this_00;
  vector<int,_std::allocator<int>_> *in_RSI;
  ostringstream oss;
  string local_1b8 [48];
  ostringstream local_188 [376];
  vector<int,_std::allocator<int>_> *local_10;
  
  local_10 = in_RSI;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  if (sVar1 == 2) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_10,0);
    if (*pvVar2 == 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_10,1);
      if (*pvVar2 == 2) {
        return;
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar3 = std::operator<<((ostream *)local_188,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x55);
  std::operator<<(poVar3," f.size()==2 && f[0]==1 && f[1]==2");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_1b8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void compiles3cr(std::vector<int> const &f) {  TEST(f.size()==2 && f[0]==1 && f[1]==2); }